

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_calc_tile_rows(long *tlpixel,long *tfpixel,int ndim,long *trowsize,long *ntrows,int *status
                       )

{
  long lVar1;
  long np;
  int ii;
  int *status_local;
  long *ntrows_local;
  long *trowsize_local;
  int ndim_local;
  long *tfpixel_local;
  long *tlpixel_local;
  
  if (*status == 0) {
    *trowsize = 0;
    *ntrows = 1;
    for (np._4_4_ = 0; np._4_4_ < ndim; np._4_4_ = np._4_4_ + 1) {
      lVar1 = (tlpixel[np._4_4_] - tfpixel[np._4_4_]) + 1;
      if (1 < lVar1) {
        if (*trowsize == 0) {
          *trowsize = lVar1;
        }
        else {
          *ntrows = lVar1 * *ntrows;
        }
      }
    }
    if (*trowsize == 0) {
      *trowsize = 1;
    }
    tlpixel_local._4_4_ = *status;
  }
  else {
    tlpixel_local._4_4_ = *status;
  }
  return tlpixel_local._4_4_;
}

Assistant:

int fits_calc_tile_rows(long *tlpixel, long *tfpixel, int ndim, long *trowsize, long *ntrows, int *status)
{

   /*  The quantizing algorithms treat all N-dimensional tiles as if they
       were 2 dimensions (trowsize * ntrows).  This sets trowsize to the
       first dimensional size encountered that's > 1 (typically the X dimension).
       ntrows will then be the product of the remaining dimensional sizes.
       
       Examples:  Tile = (5,4,1,3):  trowsize=5, ntrows=12
                  Tile = (1,1,5):  trowsize=5, ntrows=1
   */

   int ii;
   long np;
   
   if (*status)
      return (*status);
    
   *trowsize = 0; 
   *ntrows = 1;  
   for (ii=0; ii<ndim; ++ii)
   {
      np = tlpixel[ii] - tfpixel[ii] + 1;
      if (np > 1)
      {
         if (!(*trowsize))
            *trowsize = np;
         else
            *ntrows *= np;
      }
   }
   if (!(*trowsize))
   {
      /* Should only get here for the unusual case of all tile dimensions 
         having size = 1  */
      *trowsize = 1;
   }  
      
   return (*status);
}